

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtimer.cpp
# Opt level: O2

void testTimerRoutine(void)

{
  int *__mutex;
  Timer *pTVar1;
  undefined1 local_150 [8];
  TimerRoutine routine;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  milliseconds local_48;
  undefined1 local_40 [8];
  Ptr timer;
  
  hwnet::util::TimerRoutine::TimerRoutine((TimerRoutine *)local_150,1);
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x64;
  pTVar1 = (Timer *)operator_new(0x78);
  local_48 = hwnet::util::TimerRoutine::getMilliseconds((TimerRoutine *)local_150);
  local_48 = local_48 + 100;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(2);
  pcStack_50 = std::
               _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:18:23)_(std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:18:23)_(std::_Placeholder<1>)>_>
             ::_M_manager;
  hwnet::util::Timer::Timer
            (pTVar1,&local_48,
             (milliseconds *)
             &timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             false,(Callback *)&local_68);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_40,pTVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  __mutex = &routine.mgr.policy;
  std::mutex::lock((mutex *)__mutex);
  hwnet::util::TimerMgr::insert((TimerMgr *)local_150,(Ptr *)local_40);
  if (((char)routine.waitTime == '\x01') &&
     (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      (ulong)routine.begTime.__d.__r)) {
    routine.begTime.__d.__r =
         (duration)
         (duration)
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::_V2::condition_variable_any::notify_one
              ((condition_variable_any *)
               &routine.mgr.elements.
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<hwnet::util::Timer,void>
            ((__weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)&routine.waitting,
             (__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_80);
  timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc8;
  pTVar1 = (Timer *)operator_new(0x78);
  local_48 = hwnet::util::TimerRoutine::getMilliseconds((TimerRoutine *)local_150);
  local_48 = local_48 + 200;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(2);
  pcStack_50 = std::
               _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:22:23)_(std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::util::Timer>_&),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/testtimer.cpp:22:23)_(std::_Placeholder<1>)>_>
             ::_M_manager;
  hwnet::util::Timer::Timer
            (pTVar1,&local_48,
             (milliseconds *)
             &timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             false,(Callback *)&local_68);
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            ((__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> *)local_40,pTVar1);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::mutex::lock((mutex *)__mutex);
  hwnet::util::TimerMgr::insert((TimerMgr *)local_150,(Ptr *)local_40);
  if (((char)routine.waitTime == '\x01') &&
     (timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      (ulong)routine.begTime.__d.__r)) {
    routine.begTime.__d.__r =
         (duration)
         (duration)
         timer.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    std::_V2::condition_variable_any::notify_one
              ((condition_variable_any *)
               &routine.mgr.elements.
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__weak_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<hwnet::util::Timer,void>
            (local_78,(__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_70);
  local_68._M_unused._M_member_pointer = 1;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
            ((duration<long,_std::ratio<1L,_1L>_> *)&local_68);
  hwnet::util::TimerRoutine::~TimerRoutine((TimerRoutine *)local_150);
  return;
}

Assistant:

void testTimerRoutine() {
	hwnet::util::TimerRoutine routine(hwnet::util::TimerMgr::normal);


	routine.addTimer(100,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 100" << std::endl;
	});

	routine.addTimer(200,[](const hwnet::util::Timer::Ptr & t){
		std::cout << "timer 200" << std::endl;
	});	

	std::this_thread::sleep_for(std::chrono::seconds(1));

}